

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O3

int __thiscall Fl_Pixmap::copy(Fl_Pixmap *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Fl_Pixmap *this_00;
  char **ppcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int ncolors;
  int chars_per_pixel;
  char new_info [255];
  uint local_184;
  ulong local_180;
  uint local_174;
  long local_170;
  char **local_168;
  int local_15c;
  int local_158;
  int local_154;
  Fl_Pixmap *local_150;
  ulong local_148;
  char **local_140;
  char local_138 [264];
  
  iVar10 = (int)dst;
  iVar17 = (int)src;
  if (((this->super_Fl_Image).w_ == iVar10) && ((this->super_Fl_Image).h_ == iVar17)) {
    this_00 = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_00,(this->super_Fl_Image).data_);
    copy_data(this_00);
  }
  else if (iVar17 < 1 || iVar10 < 1) {
    this_00 = (Fl_Pixmap *)0x0;
  }
  else {
    __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_184,&local_174);
    local_15c = local_174 * iVar10 + 1;
    sprintf(local_138,"%d %d %d %d",(ulong)dst & 0xffffffff,(ulong)src & 0xffffffff);
    uVar3 = local_184;
    iVar1 = (this->super_Fl_Image).w_;
    local_158 = (this->super_Fl_Image).h_;
    lVar18 = (long)(int)local_174;
    local_154 = local_158 / iVar17;
    local_158 = local_158 % iVar17;
    local_180 = (ulong)local_184;
    uVar2 = iVar17 + 1 + local_184;
    if ((int)local_184 < 0) {
      uVar2 = iVar17 + 2;
    }
    local_170 = (long)(iVar1 / iVar10);
    local_148 = (ulong)src & 0xffffffff;
    ppcVar4 = (char **)operator_new__((ulong)uVar2 << 3);
    sVar5 = strlen(local_138);
    pcVar6 = (char *)operator_new__(sVar5 + 1);
    *ppcVar4 = pcVar6;
    strcpy(pcVar6,local_138);
    local_150 = this;
    local_140 = ppcVar4;
    if ((int)uVar3 < 0) {
      local_184 = -uVar3;
      pcVar6 = (char *)operator_new__((ulong)(uVar3 * -4));
      ppcVar4[1] = pcVar6;
      memcpy(pcVar6,(this->super_Fl_Image).data_[1],(ulong)(uVar3 * -4));
      local_184 = 1;
      ppcVar4 = ppcVar4 + 2;
    }
    else {
      ppcVar4 = ppcVar4 + 1;
      if (local_180 != 0) {
        local_168 = (this->super_Fl_Image).data_;
        local_180 = local_180 << 3;
        lVar15 = 0;
        do {
          pcVar6 = *(char **)((long)local_168 + lVar15 + 8);
          sVar5 = strlen(pcVar6);
          pcVar7 = (char *)operator_new__(sVar5 + 1);
          *(char **)((long)ppcVar4 + lVar15) = pcVar7;
          strcpy(pcVar7,pcVar6);
          lVar15 = lVar15 + 8;
        } while (local_180 != lVar15);
        ppcVar4 = (char **)((long)ppcVar4 + lVar15);
      }
    }
    lVar18 = lVar18 * local_170;
    local_168 = (char **)(long)local_15c;
    iVar17 = 0;
    uVar16 = local_148 & 0xffffffff;
    uVar8 = local_148;
    do {
      local_180 = uVar8;
      pcVar7 = (char *)operator_new__((ulong)local_168);
      *ppcVar4 = pcVar7;
      pcVar6 = (local_150->super_Fl_Image).data_[(long)iVar17 + (long)(int)local_184 + 1];
      uVar12 = (ulong)local_174;
      uVar8 = (ulong)dst & 0xffffffff;
      uVar11 = (ulong)dst & 0xffffffff;
      do {
        if (0 < (int)uVar12) {
          lVar15 = 0;
          do {
            pcVar7[lVar15] = pcVar6[lVar15];
            lVar15 = lVar15 + 1;
            uVar12 = (ulong)(int)local_174;
          } while (lVar15 < (long)uVar12);
          pcVar7 = pcVar7 + lVar15;
        }
        iVar9 = (int)uVar8 - iVar1 % iVar10;
        iVar13 = 0;
        if (iVar9 < 1) {
          iVar13 = (int)uVar12;
        }
        iVar14 = 0;
        if (iVar9 < 1) {
          iVar14 = iVar10;
        }
        pcVar6 = pcVar6 + iVar13 + lVar18;
        uVar8 = (ulong)(uint)(iVar9 + iVar14);
        iVar13 = (int)uVar11;
        uVar11 = (ulong)(iVar13 - 1);
      } while (1 < iVar13);
      *pcVar7 = '\0';
      iVar9 = (int)uVar16 - local_158;
      iVar13 = 0;
      if (iVar9 < 1) {
        iVar13 = (int)local_148;
      }
      iVar17 = iVar17 + local_154 + (uint)(iVar9 < 1);
      uVar16 = (ulong)(uint)(iVar9 + iVar13);
      uVar8 = (ulong)((int)local_180 - 1);
      ppcVar4 = ppcVar4 + 1;
    } while (1 < (int)local_180);
    this_00 = (Fl_Pixmap *)operator_new(0x38);
    Fl_Pixmap(this_00,local_140);
    this_00->alloc_data = 1;
  }
  return (int)this_00;
}

Assistant:

Fl_Image *Fl_Pixmap::copy(int W, int H) {
  Fl_Pixmap	*new_image;	// New pixmap

  // Optimize the simple copy where the width and height are the same...
  if (W == w() && H == h()) {
    // Make an exact copy of the image and return it...
    new_image = new Fl_Pixmap(data());
    new_image->copy_data();
    return new_image;
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and
  char		**new_data,	// New array for image data
		**new_row,	// Pointer to row in image data
		*new_ptr,	// Pointer into new array
		new_info[255];	// New information line
  const char	*old_ptr;	// Pointer into old array
  int		i,		// Looping var
		c,		// Channel number
		sy,		// Source coordinate
		dx, dy,		// Destination coordinates
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments
  int		ncolors,	// Number of colors in image
		chars_per_pixel,// Characters per color
		chars_per_line;	// Characters per line

  // Figure out how many colors there are, and how big they are...
  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);
  chars_per_line = chars_per_pixel * W + 1;

  sprintf(new_info, "%d %d %d %d", W, H, ncolors, chars_per_pixel);

  // Figure out Bresenham step/modulus values...
  xmod   = w() % W;
  xstep  = (w() / W) * chars_per_pixel;
  ymod   = h() % H;
  ystep  = h() / H;

  // Allocate memory for the new array...
  if (ncolors < 0) new_data = new char *[H + 2];
  else new_data = new char *[H + ncolors + 1];
  new_data[0] = new char[strlen(new_info) + 1];
  strcpy(new_data[0], new_info);

  // Copy colors...
  if (ncolors < 0) {
    // Copy FLTK colormap values...
    ncolors = -ncolors;
    new_row = new_data + 1;
    *new_row = new char[ncolors * 4];
    memcpy(*new_row, data()[1], ncolors * 4);
    ncolors = 1;
    new_row ++;
  } else {
    // Copy standard XPM colormap values...
    for (i = 0, new_row = new_data + 1; i < ncolors; i ++, new_row ++) {
      *new_row = new char[strlen(data()[i + 1]) + 1];
      strcpy(*new_row, data()[i + 1]);
    }
  }

  // Scale the image using a nearest-neighbor algorithm...
  for (dy = H, sy = 0, yerr = H; dy > 0; dy --, new_row ++) {
    *new_row = new char[chars_per_line];
    new_ptr  = *new_row;

    for (dx = W, xerr = W, old_ptr = data()[sy + ncolors + 1];
	 dx > 0;
	 dx --) {
      for (c = 0; c < chars_per_pixel; c ++) *new_ptr++ = old_ptr[c];

      old_ptr += xstep;
      xerr    -= xmod;

      if (xerr <= 0) {
	xerr    += W;
	old_ptr += chars_per_pixel;
      }
    }

    *new_ptr = '\0';
    sy       += ystep;
    yerr     -= ymod;
    if (yerr <= 0) {
      yerr += H;
      sy ++;
    }
  }

  new_image = new Fl_Pixmap((char*const*)new_data);
  new_image->alloc_data = 1;

  return new_image;
}